

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_image_t * encoder_get_preview(aom_codec_alg_priv_t_conflict *ctx)

{
  int iVar1;
  long in_RDI;
  YV12_BUFFER_CONFIG sd;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 in_stack_ffffffffffffff20;
  anon_union_8_2_70c94c84_for_yv12_buffer_config_2 in_stack_ffffffffffffff28;
  aom_image_t *local_8;
  
  iVar1 = av1_get_preview_raw_frame
                    ((AV1_COMP *)in_stack_ffffffffffffff28,
                     (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff20);
  if (iVar1 == 0) {
    yuvconfig2image((aom_image_t *)(in_RDI + 0xb70),(YV12_BUFFER_CONFIG *)&stack0xffffffffffffff20,
                    (void *)0x0);
    local_8 = (aom_image_t *)(in_RDI + 0xb70);
  }
  else {
    local_8 = (aom_image_t *)0x0;
  }
  return local_8;
}

Assistant:

static aom_image_t *encoder_get_preview(aom_codec_alg_priv_t *ctx) {
  YV12_BUFFER_CONFIG sd;

  if (av1_get_preview_raw_frame(ctx->ppi->cpi, &sd) == 0) {
    yuvconfig2image(&ctx->preview_img, &sd, NULL);
    return &ctx->preview_img;
  } else {
    return NULL;
  }
}